

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmMakefile.cxx
# Opt level: O2

void __thiscall
cmMakefile::AddCacheDefinition
          (cmMakefile *this,string *name,char *value,char *doc,CacheEntryType type,bool force)

{
  CacheEntryType CVar1;
  char *pcVar2;
  ulong uVar3;
  long lVar4;
  bool bVar5;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  files;
  string val;
  string nvalue;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_b8;
  char *local_a0;
  ulong local_98;
  string local_90;
  char *local_70 [4];
  string local_50;
  
  bVar5 = value != (char *)0x0;
  pcVar2 = "";
  if (bVar5) {
    pcVar2 = value;
  }
  local_a0 = doc;
  std::__cxx11::string::string((string *)&local_90,pcVar2,(allocator *)local_70);
  pcVar2 = cmState::GetInitializedCacheValue
                     (this->LocalGenerator->GlobalGenerator->CMakeInstance->State,name);
  if ((pcVar2 != (char *)0x0) &&
     (CVar1 = cmState::GetCacheEntryType
                        (this->LocalGenerator->GlobalGenerator->CMakeInstance->State,name),
     CVar1 == UNINITIALIZED)) {
    if (!force) {
      std::__cxx11::string::assign((char *)&local_90);
    }
    bVar5 = !force || bVar5;
    if (type - PATH < 2) {
      local_b8.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      local_b8.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      local_b8.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      std::__cxx11::string::string((string *)local_70,"",(allocator *)&local_50);
      cmSystemTools::ExpandListArgument(&local_90,&local_b8,false);
      lVar4 = 0;
      local_98 = (ulong)type;
      for (uVar3 = 0;
          uVar3 < (ulong)((long)local_b8.
                                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                ._M_impl.super__Vector_impl_data._M_finish -
                          (long)local_b8.
                                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                ._M_impl.super__Vector_impl_data._M_start >> 5); uVar3 = uVar3 + 1)
      {
        bVar5 = cmSystemTools::IsOff
                          (*(char **)((long)&((local_b8.
                                               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                               ._M_impl.super__Vector_impl_data._M_start)->
                                             _M_dataplus)._M_p + lVar4));
        if (!bVar5) {
          cmsys::SystemTools::CollapseFullPath
                    (&local_50,
                     (string *)
                     ((long)&((local_b8.
                               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               ._M_impl.super__Vector_impl_data._M_start)->_M_dataplus)._M_p + lVar4
                     ));
          std::__cxx11::string::operator=
                    ((string *)
                     ((long)&((local_b8.
                               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               ._M_impl.super__Vector_impl_data._M_start)->_M_dataplus)._M_p + lVar4
                     ),(string *)&local_50);
          std::__cxx11::string::~string((string *)&local_50);
        }
        if (uVar3 != 0) {
          std::__cxx11::string::append((char *)local_70);
        }
        std::__cxx11::string::append((string *)local_70);
        lVar4 = lVar4 + 0x20;
      }
      type = (CacheEntryType)local_98;
      cmState::AddCacheEntry
                (this->LocalGenerator->GlobalGenerator->CMakeInstance->State,name,local_70[0],
                 local_a0,type);
      cmState::GetInitializedCacheValue
                (this->LocalGenerator->GlobalGenerator->CMakeInstance->State,name);
      std::__cxx11::string::assign((char *)&local_90);
      std::__cxx11::string::~string((string *)local_70);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector(&local_b8);
      bVar5 = true;
    }
  }
  if (!bVar5) {
    local_90._M_dataplus._M_p = (char *)0x0;
  }
  cmState::AddCacheEntry
            (this->LocalGenerator->GlobalGenerator->CMakeInstance->State,name,
             local_90._M_dataplus._M_p,local_a0,type);
  Internals::RemoveDefinition((this->Internal).x_,name);
  std::__cxx11::string::~string((string *)&local_90);
  return;
}

Assistant:

void cmMakefile::AddCacheDefinition(const std::string& name, const char* value,
                                    const char* doc,
                                    cmState::CacheEntryType type,
                                    bool force)
{
  bool haveVal = value ? true : false;
  std::string val = haveVal ? value : "";
  const char* existingValue =
    this->GetState()->GetInitializedCacheValue(name);
  if(existingValue
      && (this->GetState()->GetCacheEntryType(name)
                                            == cmState::UNINITIALIZED))
    {
    // if this is not a force, then use the value from the cache
    // if it is a force, then use the value being passed in
    if(!force)
      {
      val = existingValue;
      haveVal = true;
      }
    if ( type == cmState::PATH || type == cmState::FILEPATH )
      {
      std::vector<std::string>::size_type cc;
      std::vector<std::string> files;
      std::string nvalue = "";
      cmSystemTools::ExpandListArgument(val, files);
      for ( cc = 0; cc < files.size(); cc ++ )
        {
        if(!cmSystemTools::IsOff(files[cc].c_str()))
          {
          files[cc] = cmSystemTools::CollapseFullPath(files[cc]);
          }
        if ( cc > 0 )
          {
          nvalue += ";";
          }
        nvalue += files[cc];
        }

      this->GetState()->AddCacheEntry(name, nvalue.c_str(), doc, type);
      val = this->GetState()->GetInitializedCacheValue(name);
      haveVal = true;
      }

    }
  this->GetState()->AddCacheEntry(name, haveVal ? val.c_str() : 0,
                                          doc, type);
  // if there was a definition then remove it
  this->Internal->RemoveDefinition(name);
}